

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkerJob.h
# Opt level: O0

void __thiscall xmrig::WorkerJob<1UL>::WorkerJob(WorkerJob<1UL> *this)

{
  Job *this_00;
  void *in_RDI;
  void *local_10;
  
  local_10 = in_RDI;
  do {
    memset(local_10,0,0x80);
    local_10 = (void *)((long)local_10 + 0x80);
  } while (local_10 != (void *)((long)in_RDI + 0x100));
  this_00 = (Job *)((long)in_RDI + 0x100);
  do {
    Job::Job(this_00);
    this_00 = this_00 + 1;
  } while (this_00 != (Job *)((long)in_RDI + 0x310));
  *(undefined4 *)((long)in_RDI + 0x310) = 0;
  *(undefined4 *)((long)in_RDI + 0x314) = 0;
  *(undefined8 *)((long)in_RDI + 0x318) = 0;
  *(undefined1 *)((long)in_RDI + 800) = 0;
  return;
}

Assistant:

inline const Job &currentJob() const    { return m_jobs[index()]; }